

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::ActivationThresholdedReLU::_InternalSerialize
          (ActivationThresholdedReLU *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *data;
  ulong uVar1;
  uint8_t *puVar2;
  int size;
  size_t __n;
  float fVar3;
  
  fVar3 = this->alpha_;
  if (fVar3 != 0.0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      fVar3 = this->alpha_;
    }
    *target = '\r';
    *(float *)(target + 1) = fVar3;
    target = target + 5;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = uVar1 & 0xfffffffffffffffc;
    data = *(void **)(uVar1 + 8);
    size = (int)*(undefined8 *)(uVar1 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar2 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar2;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* ActivationThresholdedReLU::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.ActivationThresholdedReLU)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // float alpha = 1;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_alpha = this->_internal_alpha();
  uint32_t raw_alpha;
  memcpy(&raw_alpha, &tmp_alpha, sizeof(tmp_alpha));
  if (raw_alpha != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(1, this->_internal_alpha(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.ActivationThresholdedReLU)
  return target;
}